

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::reportModifyIfContainer(CheckerVisitor *this,Expr *e,Expr *mod)

{
  ForeachStatement *this_00;
  bool bVar1;
  bool bVar2;
  TreeOp TVar3;
  pointer pSVar4;
  ArenaVector<SQCompilation::Statement_*> *this_01;
  Statement **ppSVar5;
  Node *in_RDX;
  CheckerVisitor *in_RDI;
  Statement *stmt;
  ArenaVector<SQCompilation::Statement_*> *stmts;
  Node *n_1;
  reverse_iterator it_1;
  Node *n;
  reverse_iterator it;
  ForeachStatement *f;
  bool found;
  reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
  *in_stack_ffffffffffffff88;
  Node *in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa0;
  NodeEqualChecker *in_stack_ffffffffffffffa8;
  Block *this_02;
  ForeachStatement *local_28;
  
  bVar2 = false;
  local_28 = (ForeachStatement *)0x0;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::rbegin((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
            *)in_stack_ffffffffffffff98);
  while( true ) {
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rend((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
            *)in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                             *)in_RDI,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pSVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                           *)in_RDI);
    if (pSVar4->sst == SST_NODE) {
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                             *)in_RDI);
      this_00 = (ForeachStatement *)(pSVar4->field_1).n;
      TVar3 = Node::op((Node *)this_00);
      if (TVar3 == TO_FOREACH) {
        in_stack_ffffffffffffff88 =
             (reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
              *)&in_RDI->field_0x20;
        ForeachStatement::container(this_00);
        bVar1 = NodeEqualChecker::check
                          (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98);
        local_28 = this_00;
        if (bVar1) {
          bVar2 = true;
          break;
        }
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                  *)in_RDI);
  }
  if (bVar2) {
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rbegin((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)in_stack_ffffffffffffff98);
    while( true ) {
      std::
      vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ::rend((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)in_stack_ffffffffffffff98);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_RDI,in_stack_ffffffffffffff88);
      if (!bVar2) break;
      pSVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                             *)in_RDI);
      if (pSVar4->sst == SST_NODE) {
        pSVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_RDI);
        if ((ForeachStatement *)(pSVar4->field_1).n == local_28) break;
        pSVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                               *)in_RDI);
        this_02 = (Block *)(pSVar4->field_1).n;
        TVar3 = Node::op((Node *)this_02);
        if (TVar3 == TO_BLOCK) {
          this_01 = Block::statements(this_02);
          ppSVar5 = ArenaVector<SQCompilation::Statement_*>::back(this_01);
          in_stack_ffffffffffffff98 = &(*ppSVar5)->super_Node;
          TVar3 = Node::op(in_stack_ffffffffffffff98);
          if (TVar3 == TO_RETURN) {
            return;
          }
          TVar3 = Node::op(in_stack_ffffffffffffff98);
          if (TVar3 == TO_THROW) {
            return;
          }
          TVar3 = Node::op(in_stack_ffffffffffffff98);
          if (TVar3 == TO_BREAK) {
            return;
          }
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<SQCompilation::CheckerVisitor::StackSlot_*,_std::vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>_>_>
                    *)in_RDI);
    }
    report(in_RDI,in_RDX,0x80);
  }
  return;
}

Assistant:

void CheckerVisitor::reportModifyIfContainer(const Expr *e, const Expr *mod) {
  bool found = false;
  const ForeachStatement *f = nullptr;
  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;
    if (n->op() == TO_FOREACH) {
      f = static_cast<const ForeachStatement *>(n);

      if (_equalChecker.check(f->container(), e)) {
        found = true;
        break;
      }
    }
  }

  if (!found)
    return;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    if (it->n == f)
      break;

    const Node *n = it->n;

    if (n->op() == TO_BLOCK) {
      const auto &stmts = static_cast<const Block *>(n)->statements();
      assert(stmts.size() > 0);
      const Statement *stmt = stmts.back();
      if (stmt->op() == TO_RETURN || stmt->op() == TO_THROW || stmt->op() == TO_BREAK)
        return;
    }
  }

  report(mod, DiagnosticsId::DI_MODIFIED_CONTAINER);
}